

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::FileInputStream::tryRead(FileInputStream *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  long *plVar1;
  undefined8 uVar2;
  FixVoid<unsigned_long> value;
  size_t in_R8;
  ArrayPtr<unsigned_char> AVar3;
  undefined8 local_48;
  undefined8 local_40;
  size_t result;
  size_t maxBytes_local;
  size_t minBytes_local;
  void *buffer_local;
  FileInputStream *this_local;
  
  plVar1 = *(long **)((long)buffer + 8);
  uVar2 = *(undefined8 *)((long)buffer + 0x10);
  AVar3 = arrayPtr<unsigned_char>((uchar *)minBytes,in_R8);
  local_48 = AVar3.ptr;
  local_40 = AVar3.size_;
  value = (**(code **)(*plVar1 + 0x30))(plVar1,uVar2,local_48,local_40);
  *(FixVoid<unsigned_long> *)((long)buffer + 0x10) = value + *(long *)((long)buffer + 0x10);
  Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,value);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<size_t> FileInputStream::tryRead(void* buffer, size_t minBytes, size_t maxBytes) {
  // Note that our contract with `minBytes` is that we should only return fewer than `minBytes` on
  // EOF. A file read will only produce fewer than the requested number of bytes if EOF was reached.
  // `minBytes` cannot be greater than `maxBytes`. So, this read satisfies the `minBytes`
  // requirement.
  size_t result = file.read(offset, arrayPtr(reinterpret_cast<byte*>(buffer), maxBytes));
  offset += result;
  return result;
}